

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_findfile.c
# Opt level: O3

char * checkhome(char *home,char *fname,_Bool dotscore)

{
  byte bVar1;
  int __fd;
  char *__file;
  long lVar2;
  char *pcVar3;
  byte bVar4;
  
  bVar4 = 1;
  lVar2 = 0;
  do {
    if (dotscore) {
      __file = (char *)curl_maprintf("%s/%c%s",home,(int)(char)(&DAT_00122a92)[lVar2],fname + 1);
    }
    else {
      __file = (char *)curl_maprintf("%s/%s",home,fname);
    }
    if (__file != (char *)0x0) {
      __fd = open64(__file,0);
      if (-1 < __fd) {
        pcVar3 = strdup(__file);
        close(__fd);
        curl_free(__file);
        return pcVar3;
      }
      curl_free(__file);
    }
    lVar2 = 1;
    bVar1 = bVar4 & dotscore;
    bVar4 = 0;
  } while (bVar1 != 0);
  return (char *)0x0;
}

Assistant:

static char *checkhome(const char *home, const char *fname, bool dotscore)
{
  const char pref[2] = { '.', '_' };
  int i;
  for(i = 0; i < (dotscore ? 2 : 1); i++) {
    char *c;
    if(dotscore)
      c = aprintf("%s" DIR_CHAR "%c%s", home, pref[i], &fname[1]);
    else
      c = aprintf("%s" DIR_CHAR "%s", home, fname);
    if(c) {
      int fd = open(c, O_RDONLY);
      if(fd >= 0) {
        char *path = strdup(c);
        close(fd);
        curl_free(c);
        return path;
      }
      curl_free(c);
    }
  }
  return NULL;
}